

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

int adios2sys::SystemTools::EstimateFormatLength(char *format,__va_list_tag *ap)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  uint *in_RSI;
  char *in_RDI;
  char *s;
  char *cur;
  size_t length;
  undefined8 *local_48;
  char *local_28;
  size_t local_20;
  int local_4;
  
  if (in_RDI == (char *)0x0) {
    local_4 = 0;
  }
  else {
    local_20 = strlen(in_RDI);
    local_28 = in_RDI;
    while (*local_28 != '\0') {
      pcVar5 = local_28 + 1;
      cVar1 = *local_28;
      local_28 = pcVar5;
      if (cVar1 == '%') {
        if (*pcVar5 != '%') {
          while (iVar3 = isalpha((int)*local_28), iVar3 == 0) {
            local_28 = local_28 + 1;
          }
          if ((int)*local_28 - 0x65U < 3) {
            local_20 = local_20 + 0x40;
            if (in_RSI[1] < 0xa1) {
              in_RSI[1] = in_RSI[1] + 0x10;
            }
            else {
              *(long *)(in_RSI + 2) = *(long *)(in_RSI + 2) + 8;
            }
          }
          else if (*local_28 == 0x73) {
            uVar2 = *in_RSI;
            if (uVar2 < 0x29) {
              local_48 = (undefined8 *)((long)(int)uVar2 + *(long *)(in_RSI + 4));
              *in_RSI = uVar2 + 8;
            }
            else {
              local_48 = *(undefined8 **)(in_RSI + 2);
              *(undefined8 **)(in_RSI + 2) = local_48 + 1;
            }
            if ((char *)*local_48 != (char *)0x0) {
              sVar4 = strlen((char *)*local_48);
              local_20 = sVar4 + local_20;
            }
          }
          else {
            local_20 = local_20 + 0x40;
            if (*in_RSI < 0x29) {
              *in_RSI = *in_RSI + 8;
            }
            else {
              *(long *)(in_RSI + 2) = *(long *)(in_RSI + 2) + 8;
            }
          }
        }
        local_28 = local_28 + 1;
      }
    }
    local_4 = (int)local_20;
  }
  return local_4;
}

Assistant:

int SystemTools::EstimateFormatLength(const char* format, va_list ap)
{
  if (!format) {
    return 0;
  }

  // Quick-hack attempt at estimating the length of the string.
  // Should never under-estimate.

  // Start with the length of the format string itself.

  size_t length = strlen(format);

  // Increase the length for every argument in the format.

  const char* cur = format;
  while (*cur) {
    if (*cur++ == '%') {
      // Skip "%%" since it doesn't correspond to a va_arg.
      if (*cur != '%') {
        while (!int(isalpha(*cur))) {
          ++cur;
        }
        switch (*cur) {
          case 's': {
            // Check the length of the string.
            char* s = va_arg(ap, char*);
            if (s) {
              length += strlen(s);
            }
          } break;
          case 'e':
          case 'f':
          case 'g': {
            // Assume the argument contributes no more than 64 characters.
            length += 64;

            // Eat the argument.
            static_cast<void>(va_arg(ap, double));
          } break;
          default: {
            // Assume the argument contributes no more than 64 characters.
            length += 64;

            // Eat the argument.
            static_cast<void>(va_arg(ap, int));
          } break;
        }
      }

      // Move past the characters just tested.
      ++cur;
    }
  }

  return static_cast<int>(length);
}